

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_tree_visitor.cpp
# Opt level: O3

void __thiscall ir_tree_visitor::visit(ir_tree_visitor *this,IfStatement *ptr)

{
  SubtreeWrapper *pSVar1;
  SubtreeWrapper *pSVar2;
  pointer pcVar3;
  int iVar4;
  LabelStatement *this_00;
  SeqStatement *pSVar5;
  undefined4 extraout_var;
  StatementWrapper *this_01;
  undefined4 extraout_var_00;
  Label *this_02;
  undefined1 local_110 [8];
  Label label_true;
  long local_e0;
  long *local_d0 [2];
  long local_c0 [2];
  SubtreeWrapper *local_b0;
  undefined1 local_a8 [8];
  Label label_join;
  long local_78;
  long *local_68 [2];
  long local_58 [2];
  LabelStatement *local_48;
  LabelStatement *local_40;
  LabelStatement *local_38;
  
  (**(ptr->condition->super_Base)._vptr_Base)(ptr->condition,this);
  pSVar1 = this->curr_wrapper;
  (**(ptr->do_if_true->super_Base)._vptr_Base)(ptr->do_if_true,this);
  pSVar2 = this->curr_wrapper;
  IRT::Label::Label((Label *)local_110);
  this_02 = (Label *)local_a8;
  IRT::Label::Label(this_02);
  local_b0 = pSVar1;
  local_40 = (LabelStatement *)operator_new(0x28);
  label_true.label_.field_2._8_8_ = &stack0xffffffffffffff20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&label_true.label_.field_2 + 8),local_a8,
             label_join.label_._M_dataplus._M_p + (long)local_a8);
  IRT::LabelStatement::LabelStatement(local_40,(Label *)((long)&label_true.label_.field_2 + 8));
  if ((long *)label_true.label_.field_2._8_8_ != &stack0xffffffffffffff20) {
    operator_delete((void *)label_true.label_.field_2._8_8_,local_e0 + 1);
  }
  if (pSVar2 == (SubtreeWrapper *)0x0) {
    local_38 = local_40;
  }
  else {
    local_38 = (LabelStatement *)operator_new(0x18);
    this_00 = (LabelStatement *)operator_new(0x28);
    label_join.label_.field_2._8_8_ = &stack0xffffffffffffff88;
    local_48 = this_00;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&label_join.label_.field_2 + 8),local_110,
               label_true.label_._M_dataplus._M_p + (long)local_110);
    IRT::LabelStatement::LabelStatement(this_00,(Label *)((long)&label_join.label_.field_2 + 8));
    pSVar5 = (SeqStatement *)operator_new(0x18);
    iVar4 = (*pSVar2->_vptr_SubtreeWrapper[3])(pSVar2);
    IRT::SeqStatement::SeqStatement
              (pSVar5,(Statement *)CONCAT44(extraout_var,iVar4),&local_40->super_Statement);
    IRT::SeqStatement::SeqStatement
              ((SeqStatement *)local_38,&local_48->super_Statement,(Statement *)pSVar5);
    this_02 = (Label *)local_110;
    if ((long *)label_join.label_.field_2._8_8_ != &stack0xffffffffffffff88) {
      operator_delete((void *)label_join.label_.field_2._8_8_,local_78 + 1);
    }
  }
  this_01 = (StatementWrapper *)operator_new(0x10);
  pSVar5 = (SeqStatement *)operator_new(0x18);
  local_68[0] = local_58;
  pcVar3 = (this_02->label_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar3,pcVar3 + (this_02->label_)._M_string_length);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,local_a8,label_join.label_._M_dataplus._M_p + (long)local_a8);
  iVar4 = (*local_b0->_vptr_SubtreeWrapper[4])(local_b0,local_68,local_d0);
  IRT::SeqStatement::SeqStatement
            (pSVar5,(Statement *)CONCAT44(extraout_var_00,iVar4),&local_38->super_Statement);
  IRT::StatementWrapper::StatementWrapper(this_01,(Statement *)pSVar5);
  this->curr_wrapper = (SubtreeWrapper *)this_01;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_a8 != (undefined1  [8])&label_join.label_._M_string_length) {
    operator_delete((void *)local_a8,label_join.label_._M_string_length + 1);
  }
  if (local_110 != (undefined1  [8])&label_true.label_._M_string_length) {
    operator_delete((void *)local_110,label_true.label_._M_string_length + 1);
  }
  return;
}

Assistant:

void ir_tree_visitor::visit(IfStatement* ptr) {
    ptr->condition->accept(this);
    auto condition = curr_wrapper;
    ptr->do_if_true->accept(this);
    auto true_branch = curr_wrapper;

    IRT::Label label_true;
    IRT::Label label_join;
    IRT::Statement* suffix = new IRT::LabelStatement(label_join);

    IRT::Label* result_true = &label_join;

    if (true_branch) {
        result_true = &label_true;
        suffix = new IRT::SeqStatement(
            new IRT::LabelStatement(label_true),
            new IRT::SeqStatement(true_branch->ToStatement(), suffix)
        );
    }

    curr_wrapper = new IRT::StatementWrapper(
            new IRT::SeqStatement(
                condition->ToConditional(*result_true, label_join),
                suffix
            )
    );
}